

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_double_path.cpp
# Opt level: O0

void __thiscall agg::trans_double_path::move_to2(trans_double_path *this,double x,double y)

{
  vertex_dist local_38;
  double local_20;
  double y_local;
  double x_local;
  trans_double_path *this_local;
  
  local_20 = y;
  y_local = x;
  x_local = (double)this;
  if (this->m_status2 == initial) {
    vertex_dist::vertex_dist(&local_38,x,y);
    vertex_sequence<agg::vertex_dist,_6U>::modify_last(&this->m_src_vertices2,&local_38);
    this->m_status2 = making_path;
  }
  else {
    line_to2(this,x,y);
  }
  return;
}

Assistant:

void trans_double_path::move_to2(double x, double y)
    {
        if(m_status2 == initial)
        {
            m_src_vertices2.modify_last(vertex_dist(x, y));
            m_status2 = making_path;
        }
        else
        {
            line_to2(x, y);
        }
    }